

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O1

void P_SetSlope(secplane_t *plane,bool setCeil,int xyangi,int zangi,DVector3 *pos)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  byte bVar5;
  double dVar6;
  double dVar7;
  double local_48;
  
  bVar5 = (byte)ib_compatflags;
  if (zangi < 0xb4) {
    if (zangi < 1) {
      dVar3 = 1.0;
    }
    else {
      dVar3 = (double)zangi;
    }
  }
  else {
    dVar3 = 179.0;
  }
  if (setCeil) {
    dVar3 = dVar3 + 180.0;
  }
  local_48 = FFastTrig::cos(&fasttrig,dVar3 * 11930464.711111112 + 6755399441055744.0);
  if ((bVar5 & 1) == 0) {
    dVar3 = FFastTrig::cos(&fasttrig,local_48);
    local_48 = local_48 * dVar3;
    dVar4 = FFastTrig::cos(&fasttrig,dVar3);
    dVar3 = FFastTrig::sin(&fasttrig,dVar4);
    dVar3 = dVar3 * dVar4;
  }
  else {
    dVar3 = FFastTrig::cos(&fasttrig,local_48 + 103079215104.0);
    local_48 = (double)(SUB84(dVar3 + 103079215104.0,0) * SUB84(local_48 + 103079215104.0,0)) *
               1.52587890625e-05 * 1.52587890625e-05;
    dVar3 = FFastTrig::cos(&fasttrig,local_48);
    dVar4 = FFastTrig::sin(&fasttrig,dVar3 + 103079215104.0);
    dVar3 = (double)(SUB84(dVar4 + 103079215104.0,0) * SUB84(dVar3 + 103079215104.0,0)) *
            1.52587890625e-05 * 1.52587890625e-05;
  }
  dVar7 = FFastTrig::sin(&fasttrig,dVar3);
  dVar4 = c_sqrt(dVar7 * dVar7 + dVar3 * dVar3 + local_48 * local_48);
  dVar6 = (double)(~-(ulong)(dVar4 != 0.0) & (ulong)dVar4 |
                  (ulong)(1.0 / dVar4) & -(ulong)(dVar4 != 0.0));
  dVar7 = dVar6 * dVar7;
  dVar4 = pos->X;
  dVar1 = pos->Y;
  dVar2 = pos->Z;
  (plane->normal).X = local_48 * dVar6;
  (plane->normal).Y = dVar3 * dVar6;
  (plane->normal).Z = dVar7;
  plane->D = (-(local_48 * dVar6) * dVar4 - dVar1 * dVar3 * dVar6) - dVar2 * dVar7;
  plane->negiC = -1.0 / dVar7;
  return;
}

Assistant:

void P_SetSlope (secplane_t *plane, bool setCeil, int xyangi, int zangi, const DVector3 &pos)
{
	DAngle xyang;
	DAngle zang;

	if (zangi >= 180)
	{
		zang = 179.;
	}
	else if (zangi <= 0)
	{
		zang = 1.;
	}
	else
	{
		zang = (double)zangi;
	}
	if (setCeil)
	{
		zang += 180.;
	}

	xyang = (double)xyangi;

	DVector3 norm;

	if (ib_compatflags & BCOMPATF_SETSLOPEOVERFLOW)
	{
		// We have to consider an integer multiplication overflow here.
		norm[0] = FixedToFloat(FloatToFixed(zang.Cos()) * FloatToFixed(xyang.Cos())) / 65536.;
		norm[1] = FixedToFloat(FloatToFixed(zang.Cos()) * FloatToFixed(xyang.Sin())) / 65536.;
	}
	else
	{
		norm[0] = zang.Cos() * xyang.Cos();
		norm[1] = zang.Cos() * xyang.Sin();
	}
	norm[2] = zang.Sin();
	norm.MakeUnit();
	double dist = -norm[0] * pos.X - norm[1] * pos.Y - norm[2] * pos.Z;
	plane->set(norm[0], norm[1], norm[2], dist);
}